

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symmetries.cc
# Opt level: O1

void gss::innards::find_symmetries
               (char *argv0,InputGraph *graph,
               list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *constraints,string *size)

{
  ostream *this;
  uint uVar1;
  pointer pcVar2;
  undefined1 auVar3 [16];
  exception eVar4;
  undefined3 uVar5;
  _Alloc_hider _Var6;
  undefined8 uVar7;
  _Impl *p_Var8;
  char cVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  __pid_t __pid;
  long *plVar14;
  istream *piVar15;
  ssize_t sVar16;
  undefined4 extraout_var;
  void *pvVar17;
  long lVar18;
  GapFailedUs *pGVar19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar20;
  ulong *puVar21;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar22;
  size_t __n;
  int n;
  size_type __n_00;
  int m;
  undefined1 auVar23 [16];
  string arg;
  string word;
  string line_to_write;
  int stdout_pipefd [2];
  int stdin_pipefd [2];
  string gap_helper_file_path_str;
  int wstatus;
  path gap_helper_file_path;
  stringstream stdin_stream;
  stringstream output;
  char buf [4096];
  string local_14c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_14a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1480;
  path local_1460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1438;
  int local_1418;
  int local_1414;
  int local_1410;
  int local_140c;
  ulong local_1408;
  path local_1400;
  string local_13d8;
  string *local_13b8;
  list<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
  *local_13b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_13a8;
  char *local_1388;
  int local_137c;
  undefined1 local_1378 [40];
  char *local_1350;
  undefined1 local_1348 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1338 [7];
  ios_base local_12c8 [264];
  path local_11c0 [3];
  ios_base local_1140 [264];
  undefined1 local_1038 [32];
  _Impl *local_1018;
  
  local_13b8 = size;
  local_13b0 = (list<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                *)constraints;
  local_1350 = argv0;
  std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
            ((path *)local_1378,&local_1350,auto_format);
  cVar9 = std::filesystem::__cxx11::path::has_filename();
  if (cVar9 != '\0') {
    std::filesystem::__cxx11::path::parent_path();
    std::filesystem::__cxx11::path::path<char[4],std::filesystem::__cxx11::path>
              (&local_1400,(char (*) [4])"gap",auto_format);
    std::filesystem::__cxx11::operator/((path *)local_1348,local_11c0,&local_1400);
    std::filesystem::__cxx11::path::path<char[24],std::filesystem::__cxx11::path>
              (&local_1460,(char (*) [24])"findDPfactorsOfGraphs.g",auto_format);
    std::filesystem::__cxx11::operator/((path *)local_1038,(path *)local_1348,&local_1460);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1378,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1038);
    p_Var8 = local_1018;
    uVar7 = local_1378._32_8_;
    local_1018 = (_Impl *)0x0;
    local_1378._32_8_ = p_Var8;
    if ((_Impl *)uVar7 != (_Impl *)0x0) {
      std::filesystem::__cxx11::path::_List::_Impl_deleter::operator()
                ((_Impl_deleter *)(local_1378 + 0x20),(_Impl *)uVar7);
    }
    std::filesystem::__cxx11::path::clear((path *)local_1038);
    std::filesystem::__cxx11::path::~path((path *)local_1038);
    std::filesystem::__cxx11::path::~path(&local_1460);
    std::filesystem::__cxx11::path::~path((path *)local_1348);
    std::filesystem::__cxx11::path::~path(&local_1400);
    std::filesystem::__cxx11::path::~path(local_11c0);
  }
  cVar9 = std::filesystem::status((path *)local_1378);
  if ((cVar9 == -1) || (cVar9 == '\0')) {
    pGVar19 = (GapFailedUs *)__cxa_allocate_exception(0x28);
    local_1038._0_8_ = local_1038 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1038,
               "couldn\'t find gap/findDPfactorsOfGraphs.g, which we need for symmetry detection",""
              );
    GapFailedUs::GapFailedUs(pGVar19,(string *)local_1038);
    __cxa_throw(pGVar19,&GapFailedUs::typeinfo,GapFailedUs::~GapFailedUs);
  }
  local_1400._M_pathname._M_dataplus._M_p = (pointer)&local_1400._M_pathname.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1400,local_1378._0_8_,(pointer)(local_1378._0_8_ + local_1378._8_8_));
  std::__cxx11::stringstream::stringstream((stringstream *)local_1348);
  iVar11 = InputGraph::size(graph);
  this = (ostream *)(local_1348 + 0x10);
  plVar14 = (long *)std::ostream::operator<<(this,iVar11);
  std::ios::widen((char)*(undefined8 *)(*plVar14 + -0x18) + (char)plVar14);
  std::ostream::put((char)plVar14);
  std::ostream::flush();
  iVar11 = 0;
  while( true ) {
    iVar12 = InputGraph::size(graph);
    if (iVar12 <= iVar11) break;
    iVar12 = InputGraph::degree(graph,iVar11);
    std::ostream::operator<<(this,iVar12);
    iVar12 = 0;
    while( true ) {
      iVar13 = InputGraph::size(graph);
      if (iVar13 <= iVar12) break;
      bVar10 = InputGraph::adjacent(graph,iVar11,iVar12);
      if (bVar10) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," ",1);
        std::ostream::operator<<(this,iVar12);
      }
      iVar12 = iVar12 + 1;
    }
    std::ios::widen((char)*(undefined8 *)(local_1338[0]._M_allocated_capacity - 0x18) + (char)this);
    std::ostream::put((char)this);
    std::ostream::flush();
    iVar11 = iVar11 + 1;
  }
  iVar11 = pipe2(&local_1410,0x80000);
  if (iVar11 != 0) {
    pGVar19 = (GapFailedUs *)__cxa_allocate_exception(0x28);
    local_1038._0_8_ = local_1038 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1038,"couldn\'t make stdin pipes","");
    GapFailedUs::GapFailedUs(pGVar19,(string *)local_1038);
    __cxa_throw(pGVar19,&GapFailedUs::typeinfo,GapFailedUs::~GapFailedUs);
  }
  iVar11 = pipe2(&local_1418,0x80000);
  if (iVar11 != 0) {
    pGVar19 = (GapFailedUs *)__cxa_allocate_exception(0x28);
    local_1038._0_8_ = local_1038 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1038,"couldn\'t make stdout pipes","");
    GapFailedUs::GapFailedUs(pGVar19,(string *)local_1038);
    __cxa_throw(pGVar19,&GapFailedUs::typeinfo,GapFailedUs::~GapFailedUs);
  }
  __pid = fork();
  if (__pid == -1) {
    pGVar19 = (GapFailedUs *)__cxa_allocate_exception(0x28);
    local_1038._0_8_ = local_1038 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1038,"fork failed","");
    GapFailedUs::GapFailedUs(pGVar19,(string *)local_1038);
    __cxa_throw(pGVar19,&GapFailedUs::typeinfo,GapFailedUs::~GapFailedUs);
  }
  if (__pid == 0) {
    dup2(local_1410,0);
    dup2(local_1414,1);
    execlp("gap","gap","-q","-A","-b",local_1400._M_pathname._M_dataplus._M_p,0);
    pGVar19 = (GapFailedUs *)__cxa_allocate_exception(0x28);
    local_1038._0_8_ = local_1038 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1038,"exec gap failed","");
    GapFailedUs::GapFailedUs(pGVar19,(string *)local_1038);
    __cxa_throw(pGVar19,&GapFailedUs::typeinfo,GapFailedUs::~GapFailedUs);
  }
  close(local_1410);
  close(local_1414);
  local_1460._M_pathname._M_dataplus._M_p = (pointer)&local_1460._M_pathname.field_2;
  local_1460._M_pathname._M_string_length = 0;
  local_1460._M_pathname.field_2._M_local_buf[0] = '\0';
  while( true ) {
    cVar9 = std::ios::widen((char)*(undefined8 *)(local_1348._0_8_ + -0x18) +
                            (char)(stringstream *)local_1348);
    piVar15 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                        ((istream *)local_1348,(string *)&local_1460,cVar9);
    if (((byte)piVar15[*(long *)(*(long *)piVar15 + -0x18) + 0x20] & 5) != 0) break;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&local_1460._M_pathname,"\n");
    while (local_1460._M_pathname._M_string_length != 0) {
      sVar16 = write(local_140c,local_1460._M_pathname._M_dataplus._M_p,
                     local_1460._M_pathname._M_string_length);
      if ((int)sVar16 == -1) {
        pGVar19 = (GapFailedUs *)__cxa_allocate_exception(0x28);
        local_1038._0_8_ = local_1038 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1038,"write failed","");
        GapFailedUs::GapFailedUs(pGVar19,(string *)local_1038);
        __cxa_throw(pGVar19,&GapFailedUs::typeinfo,GapFailedUs::~GapFailedUs);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                (&local_1460._M_pathname,0,(long)(int)sVar16);
    }
  }
  close(local_140c);
  std::__cxx11::stringstream::stringstream((stringstream *)local_11c0);
  while( true ) {
    sVar16 = read(local_1418,local_1038,0x1000);
    if (sVar16 == 0) break;
    if (sVar16 == -1) {
      pGVar19 = (GapFailedUs *)__cxa_allocate_exception(0x28);
      local_1480._M_dataplus._M_p = (pointer)&local_1480.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1480,"read failed","");
      GapFailedUs::GapFailedUs(pGVar19,&local_1480);
      __cxa_throw(pGVar19,&GapFailedUs::typeinfo,GapFailedUs::~GapFailedUs);
    }
    std::ostream::write(local_11c0[0]._M_pathname.field_2._M_local_buf,(long)local_1038);
  }
  close(local_1418);
  local_137c = 0;
  waitpid(__pid,&local_137c,0);
  local_1480._M_dataplus._M_p = (pointer)&local_1480.field_2;
  local_1480._M_string_length = 0;
  local_1480.field_2._M_local_buf[0] = '\0';
  local_14a0._M_dataplus._M_p = (pointer)&local_14a0.field_2;
  local_14a0._M_string_length = 0;
  local_1408 = 0;
  local_14a0.field_2._M_local_buf[0] = '\0';
  do {
    while( true ) {
      piVar15 = std::operator>>((istream *)local_11c0,(string *)&local_1480);
      piVar15 = std::operator>>(piVar15,(string *)&local_14a0);
      if (((byte)piVar15[*(long *)(*(long *)piVar15 + -0x18) + 0x20] & 5) != 0) {
        if ((local_1408 & 1) != 0) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_14a0._M_dataplus._M_p != &local_14a0.field_2) {
            operator_delete(local_14a0._M_dataplus._M_p,
                            CONCAT71(local_14a0.field_2._M_allocated_capacity._1_7_,
                                     local_14a0.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1480._M_dataplus._M_p != &local_1480.field_2) {
            operator_delete(local_1480._M_dataplus._M_p,
                            CONCAT71(local_1480.field_2._M_allocated_capacity._1_7_,
                                     local_1480.field_2._M_local_buf[0]) + 1);
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)local_11c0);
          std::ios_base::~ios_base(local_1140);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1460._M_pathname._M_dataplus._M_p != &local_1460._M_pathname.field_2) {
            operator_delete(local_1460._M_pathname._M_dataplus._M_p,
                            CONCAT71(local_1460._M_pathname.field_2._M_allocated_capacity._1_7_,
                                     local_1460._M_pathname.field_2._M_local_buf[0]) + 1);
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)local_1348);
          std::ios_base::~ios_base(local_12c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1400._M_pathname._M_dataplus._M_p != &local_1400._M_pathname.field_2) {
            operator_delete(local_1400._M_pathname._M_dataplus._M_p,
                            local_1400._M_pathname.field_2._M_allocated_capacity + 1);
          }
          std::filesystem::__cxx11::path::~path((path *)local_1378);
          return;
        }
        pGVar19 = (GapFailedUs *)__cxa_allocate_exception(0x28);
        local_14c0._M_dataplus._M_p = (pointer)&local_14c0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_14c0,"parsing output failed","");
        GapFailedUs::GapFailedUs(pGVar19,&local_14c0);
        __cxa_throw(pGVar19,&GapFailedUs::typeinfo,GapFailedUs::~GapFailedUs);
      }
      iVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               compare(&local_1480,"--pattern-automorphism-group-size");
      if (iVar11 != 0) break;
      local_1408 = CONCAT71((int7)(CONCAT44(extraout_var,iVar11) >> 8),1);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (local_13b8,&local_14a0);
    }
    iVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             compare(&local_1480,"--pattern-less-than");
    if (iVar11 != 0) {
      pGVar19 = (GapFailedUs *)__cxa_allocate_exception(0x28);
      std::operator+(&local_1438,"unknown option \'",&local_1480);
      pbVar20 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append(&local_1438,"\'");
      local_14c0._M_dataplus._M_p = (pbVar20->_M_dataplus)._M_p;
      paVar22 = &pbVar20->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_14c0._M_dataplus._M_p == paVar22) {
        local_14c0.field_2._M_allocated_capacity = paVar22->_M_allocated_capacity;
        local_14c0.field_2._8_8_ = *(undefined8 *)((long)&pbVar20->field_2 + 8);
        local_14c0._M_dataplus._M_p = (pointer)&local_14c0.field_2;
      }
      else {
        local_14c0.field_2._M_allocated_capacity = paVar22->_M_allocated_capacity;
      }
      local_14c0._M_string_length = pbVar20->_M_string_length;
      (pbVar20->_M_dataplus)._M_p = (pointer)paVar22;
      pbVar20->_M_string_length = 0;
      (pbVar20->field_2)._M_local_buf[0] = '\0';
      GapFailedUs::GapFailedUs(pGVar19,&local_14c0);
      __cxa_throw(pGVar19,&GapFailedUs::typeinfo,GapFailedUs::~GapFailedUs);
    }
    if (((local_14a0._M_string_length < 3) || (*local_14a0._M_dataplus._M_p != '\'')) ||
       (local_14a0._M_dataplus._M_p[local_14a0._M_string_length - 1] != '\'')) {
      pGVar19 = (GapFailedUs *)__cxa_allocate_exception(0x28);
      std::operator+(&local_1438,"can\'t parse pattern-less-than \'",&local_14a0);
      pbVar20 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append(&local_1438,"\': not quoted");
      auVar3._8_8_ = &local_14c0.field_2;
      auVar3._0_8_ = pbVar20;
      pcVar2 = (pbVar20->_M_dataplus)._M_p;
      auVar23._8_8_ = pcVar2;
      auVar23._0_8_ = pbVar20;
      paVar22 = &pbVar20->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 == paVar22) {
        local_14c0.field_2._M_allocated_capacity = paVar22->_M_allocated_capacity;
        local_14c0.field_2._8_8_ = *(undefined8 *)((long)&pbVar20->field_2 + 8);
        goto LAB_0015b03a;
      }
LAB_0015b02d:
      local_14c0.field_2._M_allocated_capacity = paVar22->_M_allocated_capacity;
      auVar3 = auVar23;
LAB_0015b03a:
      local_14c0._M_dataplus._M_p = auVar3._8_8_;
      puVar21 = auVar3._0_8_;
      local_14c0._M_string_length = puVar21[1];
      *puVar21 = (ulong)paVar22;
      puVar21[1] = 0;
      *(undefined1 *)(puVar21 + 2) = 0;
      GapFailedUs::GapFailedUs(pGVar19,&local_14c0);
      __cxa_throw(pGVar19,&GapFailedUs::typeinfo,GapFailedUs::~GapFailedUs);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              (&local_14a0,0,1);
    _Var6._M_p = local_14a0._M_dataplus._M_p;
    __n = local_14a0._M_string_length - 1;
    if (local_14a0._M_string_length == 0) {
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase");
    }
    local_14a0._M_dataplus._M_p[__n] = '\0';
    local_14a0._M_string_length = __n;
    if (__n == 0) {
      __n_00 = 0xffffffffffffffff;
    }
    else {
      pvVar17 = memchr(local_14a0._M_dataplus._M_p,0x3c,__n);
      __n_00 = -(ulong)(pvVar17 == (void *)0x0) | (long)pvVar17 - (long)_Var6._M_p;
    }
    if (__n_00 == 0xffffffffffffffff) goto LAB_0015afb8;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_1438,&local_14a0,0,__n_00);
    _Var6._M_p = local_1438._M_dataplus._M_p;
    pGVar19 = (GapFailedUs *)__errno_location();
    eVar4 = pGVar19->super_exception;
    uVar5 = *(undefined3 *)&pGVar19->field_0x1;
    *(uint *)pGVar19 = 0;
    lVar18 = strtol(_Var6._M_p,(char **)&local_13d8,10);
    if (local_13d8._M_dataplus._M_p == _Var6._M_p) {
      std::__throw_invalid_argument("stoi");
LAB_0015afa0:
      std::__throw_out_of_range("stoi");
LAB_0015afac:
      std::__throw_invalid_argument("stoi");
LAB_0015afb8:
      pGVar19 = (GapFailedUs *)__cxa_allocate_exception(0x28);
      std::operator+(&local_1438,"can\'t parse pattern-less-than \'",&local_14a0);
      pbVar20 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append(&local_1438,"\': no less than");
      local_14c0._M_dataplus._M_p = (pbVar20->_M_dataplus)._M_p;
      paVar22 = &pbVar20->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_14c0._M_dataplus._M_p == paVar22) {
        local_14c0.field_2._M_allocated_capacity = paVar22->_M_allocated_capacity;
        local_14c0.field_2._8_8_ = *(undefined8 *)((long)&pbVar20->field_2 + 8);
        local_14c0._M_dataplus._M_p = (pointer)&local_14c0.field_2;
      }
      else {
        local_14c0.field_2._M_allocated_capacity = paVar22->_M_allocated_capacity;
      }
      local_14c0._M_string_length = pbVar20->_M_string_length;
      (pbVar20->_M_dataplus)._M_p = (pointer)paVar22;
      pbVar20->_M_string_length = 0;
      (pbVar20->field_2)._M_local_buf[0] = '\0';
      GapFailedUs::GapFailedUs(pGVar19,&local_14c0);
      __cxa_throw(pGVar19,&GapFailedUs::typeinfo,GapFailedUs::~GapFailedUs);
    }
    if ((lVar18 - 0x80000000U < 0xffffffff00000000) || (*(uint *)pGVar19 == 0x22))
    goto LAB_0015afa0;
    if (*(uint *)pGVar19 == 0) {
      pGVar19->super_exception = eVar4;
      *(undefined3 *)&pGVar19->field_0x1 = uVar5;
    }
    InputGraph::vertex_name_abi_cxx11_(&local_14c0,graph,(int)lVar18);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_13a8,&local_14a0,__n_00 + 1,0xffffffffffffffff);
    _Var6._M_p = local_13a8._M_dataplus._M_p;
    eVar4 = pGVar19->super_exception;
    uVar5 = *(undefined3 *)&pGVar19->field_0x1;
    *(uint *)pGVar19 = 0;
    lVar18 = strtol(local_13a8._M_dataplus._M_p,&local_1388,10);
    if (local_1388 == _Var6._M_p) goto LAB_0015afac;
    paVar22 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(lVar18 - 0x80000000);
    if (paVar22 < (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0xffffffff00000000) {
LAB_0015b021:
      auVar23 = std::__throw_out_of_range("stoi");
      goto LAB_0015b02d;
    }
    uVar1 = *(uint *)pGVar19;
    paVar22 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(ulong)uVar1;
    if (uVar1 == 0x22) goto LAB_0015b021;
    if (uVar1 == 0) {
      pGVar19->super_exception = eVar4;
      *(undefined3 *)&pGVar19->field_0x1 = uVar5;
    }
    InputGraph::vertex_name_abi_cxx11_(&local_13d8,graph,(int)lVar18);
    std::__cxx11::
    list<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
    ::_M_insert<std::__cxx11::string,std::__cxx11::string>
              (local_13b0,(iterator)local_13b0,&local_14c0,&local_13d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_13d8._M_dataplus._M_p != &local_13d8.field_2) {
      operator_delete(local_13d8._M_dataplus._M_p,local_13d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_13a8._M_dataplus._M_p != &local_13a8.field_2) {
      operator_delete(local_13a8._M_dataplus._M_p,local_13a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_14c0._M_dataplus._M_p != &local_14c0.field_2) {
      operator_delete(local_14c0._M_dataplus._M_p,local_14c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1438._M_dataplus._M_p != &local_1438.field_2) {
      operator_delete(local_1438._M_dataplus._M_p,local_1438.field_2._M_allocated_capacity + 1);
    }
  } while( true );
}

Assistant:

auto gss::innards::find_symmetries(
    const char * const argv0,
    const InputGraph & graph,
    std::list<std::pair<std::string, std::string>> & constraints,
    std::string & size) -> void
{
    path gap_helper_file_path = argv0;
    if (gap_helper_file_path.has_filename()) {
        gap_helper_file_path = gap_helper_file_path.parent_path() / "gap" / "findDPfactorsOfGraphs.g";
    }

    if (! exists(gap_helper_file_path))
        throw GapFailedUs{"couldn't find gap/findDPfactorsOfGraphs.g, which we need for symmetry detection"};

#if defined(STD_FS_IS_BOOST)
    string gap_helper_file_path_str = gap_helper_file_path.string();
#else
    string gap_helper_file_path_str = gap_helper_file_path;
#endif

    stringstream stdin_stream;
    stdin_stream << graph.size() << endl;
    for (int n = 0; n < graph.size(); ++n) {
        stdin_stream << graph.degree(n);
        for (int m = 0; m < graph.size(); ++m)
            if (graph.adjacent(n, m))
                stdin_stream << " " << m;
        stdin_stream << endl;
    }

    int stdin_pipefd[2], stdout_pipefd[2];

#ifdef __linux__
    if (0 != pipe2(stdin_pipefd, O_CLOEXEC))
        throw GapFailedUs{"couldn't make stdin pipes"};
    if (0 != pipe2(stdout_pipefd, O_CLOEXEC))
        throw GapFailedUs{"couldn't make stdout pipes"};
#else
    if (0 != pipe(stdin_pipefd))
        throw GapFailedUs{"couldn't make stdin pipes"};
    if (0 != pipe(stdout_pipefd))
        throw GapFailedUs{"couldn't make stdout pipes"};
    fcntl(stdin_pipefd[0], F_SETFD, FD_CLOEXEC);
    fcntl(stdin_pipefd[1], F_SETFD, FD_CLOEXEC);
    fcntl(stdout_pipefd[0], F_SETFD, FD_CLOEXEC);
    fcntl(stdout_pipefd[1], F_SETFD, FD_CLOEXEC);
#endif

    pid_t child_pid = fork();

    if (0 == child_pid) {
        dup2(stdin_pipefd[0], STDIN_FILENO);
        dup2(stdout_pipefd[1], STDOUT_FILENO);
        execlp("gap", "gap", "-q", "-A", "-b", gap_helper_file_path_str.c_str(), static_cast<char *>(nullptr));
        throw GapFailedUs{"exec gap failed"};
    }

    if (-1 == child_pid)
        throw GapFailedUs{"fork failed"};

    close(stdin_pipefd[0]);
    close(stdout_pipefd[1]);

    string line_to_write;
    while (getline(stdin_stream, line_to_write)) {
        line_to_write.append("\n");
        while (! line_to_write.empty()) {
            int written = write(stdin_pipefd[1], line_to_write.c_str(), line_to_write.length());
            if (-1 == written)
                throw GapFailedUs{"write failed"};
            line_to_write.erase(0, written);
        }
    }
    close(stdin_pipefd[1]);

    stringstream output;

    char buf[4096];
    ssize_t read_size;
    while (true) {
        read_size = read(stdout_pipefd[0], buf, 4096);
        if (-1 == read_size)
            throw GapFailedUs{"read failed"};
        else if (0 == read_size)
            break;
        output.write(buf, read_size);
    }

    close(stdout_pipefd[0]);

    int wstatus = 0;
    waitpid(child_pid, &wstatus, 0);
    bool found_size = 0;
    string word, arg;

    while (output >> word >> arg) {
        if (word == "--pattern-automorphism-group-size") {
            size = arg;
            found_size = true;
        }
        else if (word == "--pattern-less-than") {
            if (arg.length() < 3 || '\'' != arg[0] || '\'' != arg[arg.length() - 1])
                throw GapFailedUs{"can't parse pattern-less-than '" + arg + "': not quoted"};
            arg.erase(0, 1);
            arg.erase(arg.length() - 1);

            auto p = arg.find('<');
            if (p == string::npos)
                throw GapFailedUs{"can't parse pattern-less-than '" + arg + "': no less than"};
            constraints.emplace_back(graph.vertex_name(stoi(arg.substr(0, p))), graph.vertex_name(stoi(arg.substr(p + 1))));
        }
        else
            throw GapFailedUs{"unknown option '" + word + "'"};
    }

    if (! found_size)
        throw GapFailedUs{"parsing output failed"};
}